

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::FdObserver::~FdObserver(FdObserver *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_38;
  Fault f;
  anon_class_8_1_8991fb9c local_20;
  SyscallResult local_14;
  FdObserver *pFStack_10;
  SyscallResult _kjSyscallResult;
  FdObserver *this_local;
  
  local_20.this = this;
  pFStack_10 = this;
  local_14 = kj::_::Debug::syscall<kj::UnixEventPort::FdObserver::~FdObserver()::__0>
                       (&local_20,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_14);
    kj::_::Debug::Fault::Fault
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x1d1,osErrorNumber,"epoll_ctl(eventPort.epollFd, EPOLL_CTL_DEL, fd, nullptr)","");
    kj::_::Debug::Fault::~Fault(&local_38);
  }
  Maybe<bool>::~Maybe(&this->atEnd);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->hupFulfiller);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->urgentFulfiller);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->writeFulfiller);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->readFulfiller);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

UnixEventPort::FdObserver::~FdObserver() noexcept(false) {
  KJ_SYSCALL(epoll_ctl(eventPort.epollFd, EPOLL_CTL_DEL, fd, nullptr)) { break; }
}